

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_entity_t find_as_alias(ecs_world_t *world,char *name)

{
  int32_t iVar1;
  int iVar2;
  void *pvVar3;
  ecs_alias_t *aliases;
  int32_t count;
  int32_t i;
  char *name_local;
  ecs_world_t *world_local;
  
  iVar1 = ecs_vector_count(world->aliases);
  pvVar3 = _ecs_vector_first(world->aliases,0x10,0x10);
  aliases._4_4_ = 0;
  while( true ) {
    if (iVar1 <= aliases._4_4_) {
      return 0;
    }
    iVar2 = strcmp(*(char **)((long)pvVar3 + (long)aliases._4_4_ * 0x10),name);
    if (iVar2 == 0) break;
    aliases._4_4_ = aliases._4_4_ + 1;
  }
  return *(ecs_entity_t *)((long)pvVar3 + (long)aliases._4_4_ * 0x10 + 8);
}

Assistant:

static
ecs_entity_t find_as_alias(
    ecs_world_t *world,
    const char *name)
{
    int32_t i, count = ecs_vector_count(world->aliases);
    ecs_alias_t *aliases = ecs_vector_first(world->aliases, ecs_alias_t);
    for (i = 0; i < count; i ++) {
        if (!strcmp(aliases[i].name, name)) {
            return aliases[i].entity;
        }
    }

    return 0;
}